

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * pstore::path::posix::join
                   (string *__return_storage_ptr__,string *a,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *p)

{
  bool bVar1;
  const_iterator pbVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_local;
  string *a_local;
  string *path;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)a);
  __end2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(p);
  pbVar2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(p);
  for (; __end2 != pbVar2; __end2 = __end2 + 1) {
    bVar1 = anon_unknown.dwarf_1c4263::starts_with(__end2,'/');
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)__end2);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) != 0) ||
         (bVar1 = anon_unknown.dwarf_1c4263::ends_with(__return_storage_ptr__,'/'), bVar1)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)__end2);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)__end2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join (std::string const & a, std::initializer_list<std::string> const & p) {
                std::string path = a;
                for (auto const & b : p) {
                    if (starts_with (b, '/')) {
                        path = b;
                    } else if (path.empty () || ends_with (path, '/')) {
                        path += b;
                    } else {
                        path += '/';
                        path += b;
                    }
                }
                return path;
            }